

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_extract2.c
# Opt level: O0

int archive_read_extract2(archive *_a,archive_entry *entry,archive *ad)

{
  uint uVar1;
  wchar_t wVar2;
  uint uVar3;
  int64_t iVar4;
  int64_t in_RDX;
  archive_entry *in_RSI;
  archive *in_RDI;
  int r2;
  int r;
  archive_read *a;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  if (*(int *)&in_RDI[1].vtable != 0) {
    archive_write_disk_set_skip_file(in_RDI,(int64_t)in_RSI,in_RDX);
  }
  uVar1 = archive_write_header
                    (in_RDI,(archive_entry *)
                            CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if ((int)uVar1 < -0x14) {
    uVar1 = 0xffffffec;
  }
  if (uVar1 == 0) {
    wVar2 = archive_entry_size_is_set(in_RSI);
    if ((wVar2 == L'\0') || (iVar4 = archive_entry_size(in_RSI), 0 < iVar4)) {
      uVar1 = copy_data(&a->archive,_r2);
    }
  }
  else {
    archive_copy_error(in_RDI,(archive *)CONCAT44(uVar1,in_stack_ffffffffffffffd8));
  }
  uVar3 = archive_write_finish_entry((archive *)0x129392);
  if ((int)uVar3 < -0x14) {
    uVar3 = 0xffffffec;
  }
  if ((uVar3 != 0) && (uVar1 == 0)) {
    archive_copy_error(in_RDI,(archive *)(ulong)uVar3);
  }
  if ((int)uVar3 < (int)uVar1) {
    uVar1 = uVar3;
  }
  return uVar1;
}

Assistant:

int
archive_read_extract2(struct archive *_a, struct archive_entry *entry,
    struct archive *ad)
{
	struct archive_read *a = (struct archive_read *)_a;
	int r, r2;

	/* Set up for this particular entry. */
	if (a->skip_file_set)
		archive_write_disk_set_skip_file(ad,
		    a->skip_file_dev, a->skip_file_ino);
	r = archive_write_header(ad, entry);
	if (r < ARCHIVE_WARN)
		r = ARCHIVE_WARN;
	if (r != ARCHIVE_OK)
		/* If _write_header failed, copy the error. */
 		archive_copy_error(&a->archive, ad);
	else if (!archive_entry_size_is_set(entry) || archive_entry_size(entry) > 0)
		/* Otherwise, pour data into the entry. */
		r = copy_data(_a, ad);
	r2 = archive_write_finish_entry(ad);
	if (r2 < ARCHIVE_WARN)
		r2 = ARCHIVE_WARN;
	/* Use the first message. */
	if (r2 != ARCHIVE_OK && r == ARCHIVE_OK)
		archive_copy_error(&a->archive, ad);
	/* Use the worst error return. */
	if (r2 < r)
		r = r2;
	return (r);
}